

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPureVector.cpp
# Opt level: O1

bool __thiscall PolicyPureVector::Increment(PolicyPureVector *this)

{
  pointer puVar1;
  undefined1 auVar2 [16];
  int iVar3;
  long *plVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  bool bVar10;
  
  lVar8 = *(long *)&this->field_0x18;
  if (lVar8 == 0) {
    lVar8 = *(long *)&this->field_0x20;
  }
  plVar4 = (long *)__dynamic_cast(lVar8,&Interface_ProblemToPolicyDiscrete::typeinfo,
                                  &Interface_ProblemToPolicyDiscretePure::typeinfo,0);
  uVar5 = (**(code **)(*plVar4 + 0x20))(plVar4,this->_m_agentI);
  lVar8 = *(long *)&this->field_0x18;
  if (lVar8 == 0) {
    lVar8 = *(long *)&this->field_0x20;
  }
  plVar4 = (long *)__dynamic_cast(lVar8,&Interface_ProblemToPolicyDiscrete::typeinfo,
                                  &Interface_ProblemToPolicyDiscretePure::typeinfo,0);
  iVar3 = (**(code **)(*plVar4 + 0x28))
                    (plVar4,this->_m_agentI,*(undefined4 *)&this->field_0x30,
                     *(undefined8 *)&this->field_0x8);
  puVar1 = (this->_m_domainToActionIndices).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (long)(this->_m_domainToActionIndices).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1 >> 2;
  uVar9 = iVar3 - 1;
  bVar10 = true;
  uVar7 = (ulong)uVar9;
  while( true ) {
    if (!bVar10) {
      return bVar10;
    }
    if (uVar6 <= uVar9) break;
    iVar3 = iVar3 + -1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar5;
    auVar2 = ZEXT416(puVar1[uVar7] + 1) % auVar2;
    puVar1[uVar7] = auVar2._0_4_;
    bVar10 = auVar2._0_8_ == 0;
    uVar7 = uVar7 - 1;
    if (iVar3 == 0) {
      return bVar10;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7,uVar6
            );
}

Assistant:

bool PolicyPureVector::Increment()
{
    bool carry_over = true;
    size_t nrA = GetInterfacePTPDiscretePure()->GetNrActions(_m_agentI);
    size_t nrOH = GetInterfacePTPDiscretePure()->
        GetNrPolicyDomainElements(_m_agentI, GetPolicyDomainCategory(),
                                  GetDepth());

    //i is an integer index counting from nrObservationHistories-1 (=the last
    // observation history) to 0
    //(corresponding to the first (empty) observation sequence.
    Index i = nrOH - 1;
    while(carry_over)
    {
        _m_domainToActionIndices.at(i) = (_m_domainToActionIndices.at(i) + 1) % nrA;
        carry_over = (_m_domainToActionIndices.at(i) == 0);
        if(i > 0)
            i--;
        else
            break;
    }
    return(carry_over);
}